

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O3

int __thiscall PeleLM::init(PeleLM *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  pointer pSVar7;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_00;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_01;
  long lVar8;
  long lVar9;
  double *pdVar10;
  long lVar11;
  long lVar12;
  double *pdVar13;
  long lVar14;
  long lVar15;
  TimeCenter TVar16;
  int extraout_EAX;
  int *piVar17;
  long lVar18;
  long lVar19;
  double *pdVar20;
  double *pdVar21;
  long lVar22;
  long lVar23;
  double *pdVar24;
  double *pdVar25;
  int iVar26;
  bool bVar27;
  Real time;
  MFIter mfi;
  FillPatchIterator FctCntfpi;
  FillPatchIterator Ydotfpi;
  ulong local_548;
  Box local_53c;
  Array4<double> *local_520;
  Array4<const_double> *local_518;
  Array4<double> *local_510;
  Array4<const_double> *local_508;
  Array4<const_double> *local_500;
  long local_4f8;
  Array4<double> *local_4f0;
  Array4<const_double> *local_4e8;
  Array4<double> *local_4e0;
  long local_4d8;
  long local_4d0;
  ulong local_4c8;
  IntVect local_4bc;
  MFIter local_4b0;
  FillPatchIterator local_450;
  FillPatchIterator local_240;
  
  NavierStokesBase::init(&this->super_NavierStokesBase,ctx);
  lVar18 = *(long *)(ctx + 0x170);
  TVar16 = amrex::StateDescriptor::timeType(*(StateDescriptor **)(lVar18 + 8));
  if (TVar16 == Point) {
    time = *(Real *)(lVar18 + 0xb0);
  }
  else {
    time = (*(double *)(lVar18 + 0xa8) + *(double *)(lVar18 + 0xb0)) * 0.5;
  }
  pSVar7 = (this->super_NavierStokesBase).super_AmrLevel.state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       pSVar7[RhoYdot_Type].new_data._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  this_01.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       pSVar7[FuncCount_Type].new_data._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  RhoH_to_Temp((MultiFab *)
               (pSVar7->new_data)._M_t.
               super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,0,0);
  amrex::FillPatchIterator::FillPatchIterator
            (&local_240,(AmrLevel *)ctx,
             (MultiFab *)
             this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
             ((IntVect *)
             ((long)this_00.
                    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                    .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0))->vect[0],
             time,RhoYdot_Type,0,0x15);
  amrex::FillPatchIterator::FillPatchIterator
            (&local_450,(AmrLevel *)ctx,
             (MultiFab *)
             this_01.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
             ((IntVect *)
             ((long)this_01.
                    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                    .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0))->vect[0],
             time,FuncCount_Type,0,1);
  amrex::FabArray<amrex::FArrayBox>::build_arrays<amrex::FArrayBox,_0>
            (&local_240.m_fabs.super_FabArray<amrex::FArrayBox>);
  local_508 = local_240.m_fabs.super_FabArray<amrex::FArrayBox>.m_const_arrays.hp;
  amrex::FabArray<amrex::FArrayBox>::build_arrays<amrex::FArrayBox,_0>
            ((FabArray<amrex::FArrayBox> *)
             this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl);
  local_510 = ((MultiArray4<double> *)
              ((long)this_00.
                     super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                     .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0x128))->hp;
  amrex::FabArray<amrex::FArrayBox>::build_arrays<amrex::FArrayBox,_0>
            (&local_450.m_fabs.super_FabArray<amrex::FArrayBox>);
  local_518 = local_450.m_fabs.super_FabArray<amrex::FArrayBox>.m_const_arrays.hp;
  amrex::FabArray<amrex::FArrayBox>::build_arrays<amrex::FArrayBox,_0>
            ((FabArray<amrex::FArrayBox> *)
             this_01.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl);
  local_520 = ((MultiArray4<double> *)
              ((long)this_01.
                     super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                     .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0x128))->hp;
  local_4bc.vect[0] = 0;
  local_4bc.vect[1] = 0;
  local_4bc.vect[2] = 0;
  local_53c.smallend.vect[1] = amrex::Gpu::Device::max_gpu_streams;
  local_53c.smallend.vect[2] = (undefined4)amrex::FabArrayBase::mfiter_tile_size;
  local_53c.bigend.vect[0] = amrex::FabArrayBase::mfiter_tile_size._4_4_;
  local_53c.bigend.vect[1] = DAT_00810ec0;
  local_53c.smallend.vect[0] = CONCAT13(local_53c.smallend.vect[0]._3_1_,0x10001);
  amrex::MFIter::MFIter(&local_4b0,(FabArrayBase *)&local_240.m_fabs,(MFItInfo *)&local_53c);
  if (local_4b0.currentIndex < local_4b0.endIndex) {
    do {
      amrex::MFIter::growntilebox(&local_53c,&local_4b0,&local_4bc);
      piVar17 = &local_4b0.currentIndex;
      if (local_4b0.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar17 = ((local_4b0.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + local_4b0.currentIndex;
      }
      if (local_53c.smallend.vect[2] <= local_53c.bigend.vect[2]) {
        local_4c8 = (ulong)(uint)local_53c.bigend.vect[0];
        lVar18 = (long)local_53c.smallend.vect[0];
        iVar26 = *piVar17;
        local_4e8 = local_518 + iVar26;
        local_4f0 = local_520 + iVar26;
        local_500 = local_508 + iVar26;
        local_4e0 = local_510 + iVar26;
        local_4f8 = lVar18 * 8;
        local_548 = local_53c._8_8_ & 0xffffffff;
        do {
          if (local_53c.smallend.vect[1] <= local_53c.bigend.vect[1]) {
            local_4d8 = (long)(int)local_548;
            iVar26 = local_53c.smallend.vect[1];
            do {
              if (local_53c.smallend.vect[0] <= local_53c.bigend.vect[0]) {
                lVar23 = (long)iVar26;
                iVar1 = (local_4e8->begin).y;
                lVar8 = local_4e8->jstride;
                iVar2 = (local_4e8->begin).z;
                lVar9 = local_4e8->kstride;
                iVar3 = (local_4e8->begin).x;
                pdVar10 = local_4e8->p;
                iVar4 = (local_4f0->begin).x;
                iVar5 = (local_4f0->begin).y;
                lVar11 = local_4f0->jstride;
                iVar6 = (local_4f0->begin).z;
                lVar12 = local_4f0->kstride;
                pdVar13 = local_4f0->p;
                local_4d0 = (long)(local_500->begin).x;
                pdVar21 = local_4e0->p +
                          lVar18 + (((local_4d8 - (local_4e0->begin).z) * local_4e0->kstride +
                                    (lVar23 - (local_4e0->begin).y) * local_4e0->jstride) -
                                   (long)(local_4e0->begin).x);
                lVar14 = local_500->nstride;
                lVar15 = local_4e0->nstride;
                pdVar25 = local_500->p +
                          lVar18 + (((local_4d8 - (local_500->begin).z) * local_500->kstride +
                                    (lVar23 - (local_500->begin).y) * local_500->jstride) -
                                   local_4d0);
                lVar19 = lVar18;
                do {
                  pdVar13[(lVar23 - iVar5) * lVar11 +
                          (local_4d8 - iVar6) * lVar12 + (lVar19 - iVar4)] =
                       pdVar10[(lVar23 - iVar1) * lVar8 +
                               (local_4d8 - iVar2) * lVar9 + (lVar19 - iVar3)];
                  lVar22 = 0x15;
                  pdVar20 = pdVar21;
                  pdVar24 = pdVar25;
                  do {
                    *pdVar20 = *pdVar24;
                    pdVar20 = pdVar20 + lVar15;
                    pdVar24 = pdVar24 + lVar14;
                    lVar22 = lVar22 + -1;
                  } while (lVar22 != 0);
                  lVar19 = lVar19 + 1;
                  pdVar21 = pdVar21 + 1;
                  pdVar25 = pdVar25 + 1;
                } while (local_53c.bigend.vect[0] + 1U != (int)lVar19);
              }
              bVar27 = iVar26 != local_53c.bigend.vect[1];
              iVar26 = iVar26 + 1;
            } while (bVar27);
          }
          bVar27 = (int)local_548 != local_53c.bigend.vect[2];
          local_548 = (ulong)((int)local_548 + 1);
        } while (bVar27);
      }
      amrex::MFIter::operator++(&local_4b0);
    } while (local_4b0.currentIndex < local_4b0.endIndex);
  }
  amrex::MFIter::~MFIter(&local_4b0);
  amrex::FillPatchIterator::~FillPatchIterator(&local_450);
  amrex::FillPatchIterator::~FillPatchIterator(&local_240);
  return extraout_EAX;
}

Assistant:

void
PeleLM::init (AmrLevel& old)
{
   NavierStokesBase::init(old);

   PeleLM* oldht    = (PeleLM*) &old;
   const Real    tnp1 = oldht->state[State_Type].curTime();

   //
   // Get good version of rhoYdot and Function count
   //
   MultiFab& Ydot = get_new_data(RhoYdot_Type);
   MultiFab& FuncCount = get_new_data(FuncCount_Type);
   RhoH_to_Temp(get_new_data(State_Type));

   FillPatchIterator Ydotfpi(*oldht,Ydot,Ydot.nGrow(),tnp1,RhoYdot_Type,0,NUM_SPECIES);
   const MultiFab& Ydot_old = Ydotfpi.get_mf();

   FillPatchIterator FctCntfpi(*oldht,FuncCount,FuncCount.nGrow(),tnp1,FuncCount_Type,0,1);
   const MultiFab& FuncCount_old = FctCntfpi.get_mf();

   auto const& orYdotma = Ydot_old.const_arrays();
   auto const& nrYdotma = Ydot.arrays();
   auto const& oFctCma  = FuncCount_old.const_arrays();
   auto const& nFctCma  = FuncCount.arrays();
   amrex::ParallelFor(Ydot_old,
   [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
   {
      nFctCma[box_no](i,j,k) = oFctCma[box_no](i,j,k);
      for (int n = 0; n < NUM_SPECIES; n++) {
         nrYdotma[box_no](i,j,k,n) = orYdotma[box_no](i,j,k,n);
      }
   });
}